

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O2

int MetaSim::GnuPlotOutput::init(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int in_EAX;
  ostream *poVar4;
  Exc *this;
  string *psVar5;
  undefined8 *puVar6;
  allocator local_2b2;
  allocator local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream f;
  
  puVar6 = &BaseStat::_statList_abi_cxx11_;
  while( true ) {
    do {
      puVar6 = (undefined8 *)*puVar6;
      if (puVar6 == &BaseStat::_statList_abi_cxx11_) {
        return in_EAX;
      }
      lVar1 = puVar6[2];
      poVar4 = std::operator<<((ostream *)&std::cout,"Name: ");
      psVar5 = (string *)(lVar1 + 8);
      std::__cxx11::string::string((string *)&f,psVar5);
      poVar4 = std::operator<<(poVar4,(string *)&f);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&f);
      std::__cxx11::string::string((string *)&f,psVar5);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,"");
      in_EAX = std::__cxx11::string::~string((string *)&f);
    } while (!bVar2);
    std::__cxx11::string::string((string *)&local_2b0,psVar5);
    std::ofstream::ofstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
               local_2b0._M_dataplus._M_p,_S_out);
    std::__cxx11::string::~string((string *)&local_2b0);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') break;
    poVar4 = std::operator<<((ostream *)&f,"# ");
    std::__cxx11::string::string((string *)&local_2b0,psVar5);
    poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_2b0);
    in_EAX = std::ofstream::~ofstream
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  }
  this = (Exc *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_2b0,psVar5);
  std::operator+(&local_250,"Cannot open file ",&local_2b0);
  std::__cxx11::string::string((string *)&local_270,"GnuPlotOutput",&local_2b1);
  std::__cxx11::string::string((string *)&local_290,"basestat.hpp",&local_2b2);
  Exc::Exc(this,&local_250,&local_270,&local_290);
  __cxa_throw(this,&Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void GnuPlotOutput::init()
    {
        BaseStat::List::const_iterator i  = BaseStat::begin();
        while (i != BaseStat::end()) {
            BaseStat* p = *i;
            cout << "Name: " << p->getName() << endl;

            if (p->getName() != "") {
                ofstream f(p->getName().c_str());

                if (!f.is_open())
                    throw Exc("Cannot open file " + p->getName());

                f << "# " << p->getName() << endl;
            }
            ++i;
        }
    }